

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer *
SerializePointer<vertex_t>
          (FSerializer *arc,char *key,vertex_t **value,vertex_t **defval,vertex_t *base)

{
  bool bVar1;
  vertex_t *local_48;
  long local_40;
  long local_38;
  int64_t vv;
  vertex_t *base_local;
  vertex_t **defval_local;
  vertex_t **value_local;
  char *key_local;
  FSerializer *arc_local;
  
  vv = (int64_t)base;
  base_local = (vertex_t *)defval;
  defval_local = value;
  value_local = (vertex_t **)key;
  key_local = (char *)arc;
  if (base != (vertex_t *)0x0) {
    bVar1 = FSerializer::isReading(arc);
    if ((((bVar1) || (bVar1 = FWriter::inObject(*(FWriter **)key_local), !bVar1)) ||
        (base_local == (vertex_t *)0x0)) || (*defval_local != (vertex_t *)(base_local->p).X)) {
      if (*defval_local == (vertex_t *)0x0) {
        local_40 = -1;
      }
      else {
        local_40 = (long)*defval_local - vv >> 4;
      }
      local_38 = local_40;
      Serialize((FSerializer *)key_local,(char *)value_local,&local_38,(int64_t *)0x0);
      if (local_38 < 0) {
        local_48 = (vertex_t *)0x0;
      }
      else {
        local_48 = (vertex_t *)(vv + local_38 * 0x10);
      }
      *defval_local = local_48;
    }
    return (FSerializer *)key_local;
  }
  __assert_fail("base != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                ,0x59f,
                "FSerializer &SerializePointer(FSerializer &, const char *, T *&, T **, T *) [T = vertex_t]"
               );
}

Assistant:

FSerializer &SerializePointer(FSerializer &arc, const char *key, T *&value, T **defval, T *base)
{
	assert(base != nullptr);
	if (arc.isReading() || !arc.w->inObject() || defval == nullptr || value != *defval)
	{
		int64_t vv = value == nullptr ? -1 : value - base;
		Serialize(arc, key, vv, nullptr);
		value = vv < 0 ? nullptr : base + vv;
	}
	return arc;
}